

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_DsdCheck1Step(void *p,word *pTruth,int nVarsInit,int *pVarLevels)

{
  undefined4 uVar1;
  uint uVar2;
  int v;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong *puVar15;
  uint uVar16;
  long lVar17;
  word *pwVar18;
  ulong *puVar19;
  ulong uVar20;
  int iVar21;
  int SuppSize;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  int SuppSize_1;
  word *pLimit;
  word *tLimit;
  int pVarPrios [12];
  word pCofTemp [64];
  uint auStack_268 [12];
  ulong local_238 [65];
  
  iVar13 = nVarsInit + -6;
  uVar24 = 1 << ((byte)iVar13 & 0x1f);
  uVar3 = 1;
  if (6 < nVarsInit) {
    uVar3 = uVar24;
  }
  iVar4 = Dau_DsdDecompose(pTruth,nVarsInit,0,0,(char *)0x0);
  if (iVar4 == 0) {
    iVar13 = -1;
  }
  else {
    if (iVar4 < 1) {
      __assert_fail("nSizeNonDec > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                    ,0x387,"int Dau_DsdCheck1Step(void *, word *, int, int *)");
    }
    uVar23 = (ulong)(uint)nVarsInit;
    if (0 < nVarsInit) {
      uVar8 = 0;
      do {
        auStack_268[uVar8] = (uint)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar23 != uVar8);
    }
    if (pVarLevels != (int *)0x0) {
      if (0 < nVarsInit) {
        uVar8 = 0;
        do {
          iVar4 = Dau_DsdLevelVar(p,(int)uVar8);
          *(int *)((long)local_238 + uVar8 * 4) = -iVar4;
          uVar8 = uVar8 + 1;
        } while (uVar23 != uVar8);
      }
      if (1 < nVarsInit) {
        uVar11 = 1;
        uVar8 = 0;
        do {
          uVar20 = uVar8 & 0xffffffff;
          uVar14 = uVar11;
          do {
            uVar16 = (uint)uVar14;
            if (*(int *)((long)local_238 + (long)(int)(uint)uVar20 * 4) <=
                *(int *)((long)local_238 + uVar14 * 4)) {
              uVar16 = (uint)uVar20;
            }
            uVar14 = uVar14 + 1;
            uVar20 = (ulong)uVar16;
          } while (uVar23 != uVar14);
          uVar5 = auStack_268[uVar8];
          lVar17 = (long)(int)uVar16;
          auStack_268[uVar8] = auStack_268[lVar17];
          uVar1 = *(undefined4 *)((long)local_238 + uVar8 * 4);
          *(undefined4 *)((long)local_238 + uVar8 * 4) =
               *(undefined4 *)((long)local_238 + lVar17 * 4);
          uVar8 = uVar8 + 1;
          auStack_268[lVar17] = uVar5;
          *(undefined4 *)((long)local_238 + lVar17 * 4) = uVar1;
          uVar11 = uVar11 + 1;
        } while (uVar8 != nVarsInit - 1);
      }
    }
    if (0 < nVarsInit) {
      uVar16 = uVar24;
      if ((int)uVar24 < 2) {
        uVar16 = 1;
      }
      uVar5 = 0xfffffffe;
      iVar4 = 1000000000;
      uVar8 = 0;
LAB_00500c7c:
      uVar2 = auStack_268[uVar8];
      if ((uint)nVarsInit <= uVar2) {
        __assert_fail("pVarPrios[i] >= 0 && pVarPrios[i] < nVarsInit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,0x39b,"int Dau_DsdCheck1Step(void *, word *, int, int *)");
      }
      bVar10 = (byte)uVar2;
      if (uVar3 == 1) {
        local_238[0] = (s_Truths6Neg[uVar2] & *pTruth) << ((byte)(1L << (bVar10 & 0x3f)) & 0x3f) |
                       s_Truths6Neg[uVar2] & *pTruth;
      }
      else if ((int)uVar2 < 6) {
        if (0 < (int)uVar3) {
          uVar11 = s_Truths6Neg[uVar2];
          uVar14 = 0;
          do {
            local_238[uVar14] =
                 (pTruth[uVar14] & uVar11) << ((byte)(1L << (bVar10 & 0x3f)) & 0x3f) |
                 pTruth[uVar14] & uVar11;
            uVar14 = uVar14 + 1;
          } while (uVar3 != uVar14);
        }
      }
      else if (0 < (int)uVar3) {
        bVar9 = (byte)(uVar2 - 6);
        uVar12 = 1 << (bVar9 & 0x1f);
        iVar22 = 2 << (bVar9 & 0x1f);
        uVar11 = 1;
        if (1 < (int)uVar12) {
          uVar11 = (ulong)uVar12;
        }
        puVar15 = local_238 + (int)uVar12;
        puVar19 = local_238;
        pwVar18 = pTruth;
        do {
          if (uVar2 - 6 != 0x1f) {
            uVar14 = 0;
            do {
              uVar20 = pwVar18[uVar14];
              puVar19[uVar14] = uVar20;
              puVar15[uVar14] = uVar20;
              uVar14 = uVar14 + 1;
            } while (uVar11 != uVar14);
          }
          pwVar18 = pwVar18 + iVar22;
          puVar15 = puVar15 + iVar22;
          puVar19 = puVar19 + iVar22;
        } while (pwVar18 < pTruth + (int)uVar3);
      }
      uVar11 = 0;
      iVar22 = 0;
LAB_00500d9e:
      if (nVarsInit < 7) {
        uVar12 = (uint)((s_Truths6Neg[uVar11] &
                        (local_238[0] >> ((byte)(1 << ((byte)uVar11 & 0x1f)) & 0x3f) ^ local_238[0])
                        ) != 0);
      }
      else if (uVar11 < 6) {
        uVar12 = 0;
        if (iVar13 != 0x1f) {
          uVar14 = 0;
          do {
            if (((local_238[uVar14] >> ((byte)(1 << ((byte)uVar11 & 0x1f)) & 0x3f) ^
                 local_238[uVar14]) & s_Truths6Neg[uVar11]) != 0) goto LAB_00500e76;
            uVar14 = uVar14 + 1;
            uVar12 = 0;
          } while (uVar16 != uVar14);
        }
      }
      else {
        uVar12 = 0;
        if (iVar13 != 0x1f) {
          bVar9 = (byte)(uVar11 - 6);
          uVar12 = 1 << (bVar9 & 0x1f);
          iVar6 = 2 << (bVar9 & 0x1f);
          uVar14 = 1;
          if (1 < (int)uVar12) {
            uVar14 = (ulong)uVar12;
          }
          puVar15 = local_238 + (int)uVar12;
          puVar19 = local_238;
          do {
            if (uVar11 - 6 != 0x1f) {
              uVar20 = 0;
              do {
                if (puVar19[uVar20] != puVar15[uVar20]) goto LAB_00500e76;
                uVar20 = uVar20 + 1;
              } while (uVar14 != uVar20);
            }
            puVar19 = puVar19 + iVar6;
            puVar15 = puVar15 + iVar6;
            uVar12 = 0;
          } while (puVar19 < local_238 + (int)uVar24);
        }
      }
      goto LAB_00500e82;
    }
    iVar13 = -2;
  }
  return iVar13;
LAB_00500e76:
  uVar12 = 1;
LAB_00500e82:
  iVar22 = iVar22 + uVar12;
  uVar11 = uVar11 + 1;
  if (uVar11 == uVar23) goto code_r0x00500e91;
  goto LAB_00500d9e;
code_r0x00500e91:
  iVar6 = Dau_DsdDecompose(local_238,nVarsInit,0,0,(char *)0x0);
  if (uVar3 == 1) {
    local_238[0] = (s_Truths6[uVar2] & *pTruth) >> ((byte)(1L << (bVar10 & 0x3f)) & 0x3f) |
                   s_Truths6[uVar2] & *pTruth;
  }
  else if ((int)uVar2 < 6) {
    if (0 < (int)uVar3) {
      uVar11 = s_Truths6[uVar2];
      uVar14 = 0;
      do {
        local_238[uVar14] =
             (pTruth[uVar14] & uVar11) >> ((byte)(1L << (bVar10 & 0x3f)) & 0x3f) |
             pTruth[uVar14] & uVar11;
        uVar14 = uVar14 + 1;
      } while (uVar3 != uVar14);
    }
  }
  else if (0 < (int)uVar3) {
    bVar10 = (byte)(uVar2 - 6);
    uVar12 = 1 << (bVar10 & 0x1f);
    iVar21 = 2 << (bVar10 & 0x1f);
    uVar11 = 1;
    if (1 < (int)uVar12) {
      uVar11 = (ulong)uVar12;
    }
    puVar19 = local_238;
    pwVar18 = pTruth;
    do {
      if (uVar2 - 6 != 0x1f) {
        uVar14 = 0;
        do {
          uVar20 = pwVar18[(long)(int)uVar12 + uVar14];
          puVar19[uVar14] = uVar20;
          puVar19[(long)(int)uVar12 + uVar14] = uVar20;
          uVar14 = uVar14 + 1;
        } while (uVar11 != uVar14);
      }
      pwVar18 = pwVar18 + iVar21;
      puVar19 = puVar19 + iVar21;
    } while (pwVar18 < pTruth + (int)uVar3);
  }
  uVar11 = 0;
  iVar21 = 0;
  do {
    if (nVarsInit < 7) {
      uVar12 = (uint)((s_Truths6Neg[uVar11] &
                      (local_238[0] >> ((byte)(1 << ((byte)uVar11 & 0x1f)) & 0x3f) ^ local_238[0]))
                     != 0);
    }
    else if (uVar11 < 6) {
      uVar12 = 0;
      if (iVar13 != 0x1f) {
        uVar14 = 0;
        do {
          if (((local_238[uVar14] >> ((byte)(1 << ((byte)uVar11 & 0x1f)) & 0x3f) ^ local_238[uVar14]
               ) & s_Truths6Neg[uVar11]) != 0) {
            uVar12 = 1;
            break;
          }
          uVar14 = uVar14 + 1;
          uVar12 = 0;
        } while (uVar16 != uVar14);
      }
    }
    else {
      uVar12 = 0;
      if (iVar13 != 0x1f) {
        bVar10 = (byte)(uVar11 - 6);
        uVar12 = 1 << (bVar10 & 0x1f);
        iVar7 = 2 << (bVar10 & 0x1f);
        uVar14 = 1;
        if (1 < (int)uVar12) {
          uVar14 = (ulong)uVar12;
        }
        puVar15 = local_238 + (int)uVar12;
        puVar19 = local_238;
        do {
          if (uVar11 - 6 != 0x1f) {
            uVar20 = 0;
            do {
              if (puVar19[uVar20] != puVar15[uVar20]) {
                uVar12 = 1;
                goto LAB_005010c9;
              }
              uVar20 = uVar20 + 1;
            } while (uVar14 != uVar20);
          }
          puVar19 = puVar19 + iVar7;
          puVar15 = puVar15 + iVar7;
          uVar12 = 0;
        } while (puVar19 < local_238 + (int)uVar24);
      }
    }
LAB_005010c9:
    iVar21 = iVar21 + uVar12;
    uVar11 = uVar11 + 1;
  } while (uVar11 != uVar23);
  iVar7 = Dau_DsdDecompose(local_238,nVarsInit,0,0,(char *)0x0);
  if ((iVar6 == 0 && iVar7 == 0) && iVar21 + iVar22 < iVar4) {
    iVar4 = iVar21 + iVar22;
    uVar5 = uVar2;
  }
  uVar8 = uVar8 + 1;
  if (uVar8 == uVar23) {
    return uVar5;
  }
  goto LAB_00500c7c;
}

Assistant:

int Dau_DsdCheck1Step( void * p, word * pTruth, int nVarsInit, int * pVarLevels )
{
    word pCofTemp[DAU_MAX_WORD];
    int pVarPrios[DAU_MAX_VAR];
    int nWords = Abc_TtWordNum(nVarsInit);
    int nSizeNonDec, nSizeNonDec0, nSizeNonDec1;
    int i, vBest = -2, nSumCofsBest = ABC_INFINITY, nSumCofs;
    nSizeNonDec = Dau_DsdDecompose( pTruth, nVarsInit, 0, 0, NULL );
    if ( nSizeNonDec == 0 )
        return -1;
    assert( nSizeNonDec > 0 );
    // find variable priority
    for ( i = 0; i < nVarsInit; i++ )
        pVarPrios[i] = i;
    if ( pVarLevels )
    {
        extern int Dau_DsdLevelVar( void * pMan, int iVar );
        int pVarLevels[DAU_MAX_VAR];
        for ( i = 0; i < nVarsInit; i++ )
            pVarLevels[i] = -Dau_DsdLevelVar( p, i );
//        for ( i = 0; i < nVarsInit; i++ )
//            printf( "%d ", -pVarLevels[i] );
//        printf( "\n" );
        Vec_IntSelectSortCost2( pVarPrios, nVarsInit, pVarLevels );
//        for ( i = 0; i < nVarsInit; i++ )
//            printf( "%d ", pVarPrios[i] );
//        printf( "\n\n" );
    }
    for ( i = 0; i < nVarsInit; i++ )
    {
        assert( pVarPrios[i] >= 0 && pVarPrios[i] < nVarsInit );
        // try first cofactor
        Abc_TtCofactor0p( pCofTemp, pTruth, nWords, pVarPrios[i] );
        nSumCofs = Abc_TtSupportSize( pCofTemp, nVarsInit );
        nSizeNonDec0 = Dau_DsdDecompose( pCofTemp, nVarsInit, 0, 0, NULL );
        // try second cofactor
        Abc_TtCofactor1p( pCofTemp, pTruth, nWords, pVarPrios[i] );
        nSumCofs += Abc_TtSupportSize( pCofTemp, nVarsInit );
        nSizeNonDec1 = Dau_DsdDecompose( pCofTemp, nVarsInit, 0, 0, NULL );
        // compare cofactors
        if ( nSizeNonDec0 || nSizeNonDec1 )
            continue;
        if ( nSumCofsBest > nSumCofs )
        {
            vBest = pVarPrios[i];
            nSumCofsBest = nSumCofs;
        }
    }
    return vBest;
}